

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectDeclaration_Parameter.cpp
# Opt level: O0

ostream * psy::C::operator<<(ostream *os,ParameterDeclarationSymbol *param)

{
  ostream *poVar1;
  Lexeme *this;
  Type *ty;
  string local_40;
  ObjectDeclarationSymbol *local_20;
  ParameterDeclarationSymbol *param_local;
  ostream *os_local;
  
  local_20 = &param->super_ObjectDeclarationSymbol;
  param_local = (ParameterDeclarationSymbol *)os;
  if (param == (ParameterDeclarationSymbol *)0x0) {
    os_local = std::operator<<(os,"<Parameter is null>");
  }
  else {
    std::operator<<(os,"<Parameter |");
    poVar1 = std::operator<<((ostream *)param_local," name:");
    this = &ObjectDeclarationSymbol::name(local_20)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_40,this);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    poVar1 = std::operator<<((ostream *)param_local," type:");
    ty = ObjectDeclarationSymbol::type(local_20);
    operator<<(poVar1,ty);
    std::operator<<((ostream *)param_local,">");
    os_local = (ostream *)param_local;
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const ParameterDeclarationSymbol* param)
{
    if (!param)
        return os << "<Parameter is null>";
    os << "<Parameter |";
    os << " name:" << param->name()->valueText();
    os << " type:" << param->type();
    os << ">";
    return os;
}